

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall
mkvparser::VideoTrack::VideoTrack
          (VideoTrack *this,Segment *pSegment,longlong element_start,longlong element_size)

{
  Track::Track(&this->super_Track,pSegment,element_start,element_size);
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__VideoTrack_00544398;
  this->m_colour_space = (char *)0x0;
  this->m_colour = (Colour *)0x0;
  this->m_projection = (Projection *)0x0;
  return;
}

Assistant:

VideoTrack::VideoTrack(Segment* pSegment, long long element_start,
                       long long element_size)
    : Track(pSegment, element_start, element_size),
      m_colour_space(NULL),
      m_colour(NULL),
      m_projection(NULL) {}